

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void PrintHelp(void)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Options:\n\n");
  poVar1 = std::operator<<(poVar1,"-h, --help \t print this help\n\n");
  poVar1 = std::operator<<(poVar1,"debug mode:\n");
  poVar1 = std::operator<<(poVar1,"\t -dd \t [default] disable debug\n");
  poVar1 = std::operator<<(poVar1,"\t -dp \t debug parser\n");
  poVar1 = std::operator<<(poVar1,"\t -ds \t debug scanner\n");
  poVar1 = std::operator<<(poVar1,"\t -df \t debug parser and scanner\n\n");
  poVar1 = std::operator<<(poVar1,"evaluation mode:\n");
  poVar1 = std::operator<<(poVar1,"\t -ei \t [default] immediate evaluation during parsing\n");
  poVar1 = std::operator<<(poVar1,"\t -ep \t evaluation after all input is parsed\n");
  poVar1 = std::operator<<(poVar1,"\t -ed \t disable evaluation, only parse\n\n");
  poVar1 = std::operator<<(poVar1,"input mode:\n");
  poVar1 = std::operator<<(poVar1,"\t [-ii] \t\t [default] interactive, input from terminal\n");
  poVar1 = std::operator<<(poVar1,"\t -if file \t input from file\n");
  std::operator<<(poVar1,"\t -is string \t input from next argument\n");
  return;
}

Assistant:

void PrintHelp()
{
    std::cout << "Options:\n\n"
              << "-h, --help \t print this help\n\n"
              << "debug mode:\n"
              << "\t -dd \t [default] disable debug\n"
              << "\t -dp \t debug parser\n"
              << "\t -ds \t debug scanner\n"
              << "\t -df \t debug parser and scanner\n\n"
              << "evaluation mode:\n"
              << "\t -ei \t [default] immediate evaluation during parsing\n"
              << "\t -ep \t evaluation after all input is parsed\n"
              << "\t -ed \t disable evaluation, only parse\n\n"
              << "input mode:\n"
              << "\t [-ii] \t\t [default] interactive, input from terminal\n"
              << "\t -if file \t input from file\n"
              << "\t -is string \t input from next argument\n";
}